

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

bool __thiscall
Js::JavascriptArray::IsMissingHeadSegmentItemImpl<int>(JavascriptArray *this,uint32 index)

{
  code *pcVar1;
  bool bVar2;
  SparseArraySegmentBase *pSVar3;
  undefined4 *puVar4;
  SparseArraySegmentBase **ppSVar5;
  SparseArraySegment<int> *pSVar6;
  uint32 index_local;
  JavascriptArray *this_local;
  
  pSVar3 = Memory::WriteBarrierPtr<Js::SparseArraySegmentBase>::operator->(&this->head);
  if (pSVar3->length <= index) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x32a,"(index < head->length)","index < head->length");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  ppSVar5 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase__
                      ((WriteBarrierPtr *)&this->head);
  pSVar6 = SparseArraySegment<int>::From(*ppSVar5);
  bVar2 = SparseArraySegment<int>::IsMissingItem
                    ((int *)(&pSVar6[1].super_SparseArraySegmentBase.left + index));
  return bVar2;
}

Assistant:

bool JavascriptArray::IsMissingHeadSegmentItemImpl(const uint32 index) const
    {
        Assert(index < head->length);

        return SparseArraySegment<T>::IsMissingItem(&SparseArraySegment<T>::From(head)->elements[index]);
    }